

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CreateView(Parse *pParse,Token *pBegin,Token *pName1,Token *pName2,ExprList *pCNames,
                      Select *pSelect,int isTemp,int noErr)

{
  byte *pbVar1;
  sqlite3 *db;
  Table *pTVar2;
  Schema *pSVar3;
  Db *pDVar4;
  ulong uVar5;
  int iVar6;
  Select *pSVar7;
  ExprList *pEVar8;
  Schema **ppSVar9;
  Token *pName;
  DbFixer sFix;
  Token local_b8;
  Token *local_a8;
  Table *local_a0;
  Token *local_98;
  Parse *local_90;
  Walker local_88;
  Schema *local_58;
  undefined1 local_50;
  char *local_48;
  char *local_40;
  Token *local_38;
  
  local_a8 = (Token *)0x0;
  db = pParse->db;
  if (pParse->nVar < 1) {
    local_98 = pBegin;
    sqlite3StartTable(pParse,pName1,pName2,isTemp,1,0,noErr);
    pTVar2 = pParse->pNewTable;
    if ((pTVar2 != (Table *)0x0) && (pParse->nErr == 0)) {
      pbVar1 = (byte *)((long)&pTVar2->tabFlags + 1);
      *pbVar1 = *pbVar1 | 2;
      local_a0 = pTVar2;
      sqlite3TwoPartName(pParse,pName1,pName2,&local_a8);
      pTVar2 = local_a0;
      if (local_a0->pSchema == (Schema *)0x0) {
        iVar6 = -0x8000;
      }
      else {
        iVar6 = -1;
        ppSVar9 = &db->aDb->pSchema;
        do {
          iVar6 = iVar6 + 1;
          pSVar3 = *ppSVar9;
          ppSVar9 = ppSVar9 + 4;
        } while (pSVar3 != local_a0->pSchema);
      }
      pDVar4 = pParse->db->aDb;
      local_48 = pDVar4[iVar6].zDbSName;
      local_58 = pDVar4[iVar6].pSchema;
      local_40 = "view";
      local_38 = local_a8;
      local_50 = iVar6 == 1;
      local_88.xExprCallback = fixExprCb;
      local_88.xSelectCallback = fixSelectCb;
      local_88.xSelectCallback2 = sqlite3WalkWinDefnDummyCallback;
      local_88.walkerDepth = 0;
      local_88.eCode = 0;
      local_88.u.pNC = (NameContext *)&local_90;
      local_90 = pParse;
      local_88.pParse = pParse;
      iVar6 = sqlite3WalkSelect(&local_88,pSelect);
      if (iVar6 == 0) {
        pbVar1 = (byte *)((long)&pSelect->selFlags + 2);
        *pbVar1 = *pbVar1 | 0x20;
        if (pParse->eParseMode < 2) {
          pSVar7 = sqlite3SelectDup(db,pSelect,1);
        }
        else {
          pSVar7 = pSelect;
          pSelect = (Select *)0x0;
        }
        (pTVar2->u).view.pSelect = pSVar7;
        pEVar8 = sqlite3ExprListDup(db,pCNames,1);
        pTVar2->pCheck = pEVar8;
        pTVar2->eTabType = '\x02';
        if (db->mallocFailed == '\0') {
          local_b8.z = (pParse->sLastToken).z;
          uVar5 = *(ulong *)&(pParse->sLastToken).n;
          if (*local_b8.z != ';') {
            local_b8.z = local_b8.z + (uVar5 & 0xffffffff);
          }
          local_b8.z = local_98->z + ((int)local_b8.z - (int)local_98->z);
          do {
            pbVar1 = (byte *)(local_b8.z + -1);
            local_b8.z = local_b8.z + -1;
          } while ((""[*pbVar1] & 1) != 0);
          local_b8._12_4_ = (int)(uVar5 >> 0x20);
          local_b8.n = 1;
          sqlite3EndTable(pParse,(Token *)0x0,&local_b8,0,(Select *)0x0);
        }
      }
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"parameters are not allowed in views");
  }
  if (pSelect != (Select *)0x0) {
    clearSelect(db,pSelect,1);
  }
  if (1 < pParse->eParseMode) {
    sqlite3RenameExprlistUnmap(pParse,pCNames);
  }
  if (pCNames != (ExprList *)0x0) {
    exprListDeleteNN(db,pCNames);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateView(
  Parse *pParse,     /* The parsing context */
  Token *pBegin,     /* The CREATE token that begins the statement */
  Token *pName1,     /* The token that holds the name of the view */
  Token *pName2,     /* The token that holds the name of the view */
  ExprList *pCNames, /* Optional list of view column names */
  Select *pSelect,   /* A SELECT statement that will become the new view */
  int isTemp,        /* TRUE for a TEMPORARY view */
  int noErr          /* Suppress error messages if VIEW already exists */
){
  Table *p;
  int n;
  const char *z;
  Token sEnd;
  DbFixer sFix;
  Token *pName = 0;
  int iDb;
  sqlite3 *db = pParse->db;

  if( pParse->nVar>0 ){
    sqlite3ErrorMsg(pParse, "parameters are not allowed in views");
    goto create_view_fail;
  }
  sqlite3StartTable(pParse, pName1, pName2, isTemp, 1, 0, noErr);
  p = pParse->pNewTable;
  if( p==0 || pParse->nErr ) goto create_view_fail;

  /* Legacy versions of SQLite allowed the use of the magic "rowid" column
  ** on a view, even though views do not have rowids.  The following flag
  ** setting fixes this problem.  But the fix can be disabled by compiling
  ** with -DSQLITE_ALLOW_ROWID_IN_VIEW in case there are legacy apps that
  ** depend upon the old buggy behavior. */
#ifndef SQLITE_ALLOW_ROWID_IN_VIEW
  p->tabFlags |= TF_NoVisibleRowid;
#endif

  sqlite3TwoPartName(pParse, pName1, pName2, &pName);
  iDb = sqlite3SchemaToIndex(db, p->pSchema);
  sqlite3FixInit(&sFix, pParse, iDb, "view", pName);
  if( sqlite3FixSelect(&sFix, pSelect) ) goto create_view_fail;

  /* Make a copy of the entire SELECT statement that defines the view.
  ** This will force all the Expr.token.z values to be dynamically
  ** allocated rather than point to the input string - which means that
  ** they will persist after the current sqlite3_exec() call returns.
  */
  pSelect->selFlags |= SF_View;
  if( IN_RENAME_OBJECT ){
    p->u.view.pSelect = pSelect;
    pSelect = 0;
  }else{
    p->u.view.pSelect = sqlite3SelectDup(db, pSelect, EXPRDUP_REDUCE);
  }
  p->pCheck = sqlite3ExprListDup(db, pCNames, EXPRDUP_REDUCE);
  p->eTabType = TABTYP_VIEW;
  if( db->mallocFailed ) goto create_view_fail;

  /* Locate the end of the CREATE VIEW statement.  Make sEnd point to
  ** the end.
  */
  sEnd = pParse->sLastToken;
  assert( sEnd.z[0]!=0 || sEnd.n==0 );
  if( sEnd.z[0]!=';' ){
    sEnd.z += sEnd.n;
  }
  sEnd.n = 0;
  n = (int)(sEnd.z - pBegin->z);
  assert( n>0 );
  z = pBegin->z;
  while( sqlite3Isspace(z[n-1]) ){ n--; }
  sEnd.z = &z[n-1];
  sEnd.n = 1;

  /* Use sqlite3EndTable() to add the view to the schema table */
  sqlite3EndTable(pParse, 0, &sEnd, 0, 0);

create_view_fail:
  sqlite3SelectDelete(db, pSelect);
  if( IN_RENAME_OBJECT ){
    sqlite3RenameExprlistUnmap(pParse, pCNames);
  }
  sqlite3ExprListDelete(db, pCNames);
  return;
}